

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall
Centaurus::CharClass<unsigned_char>::append(CharClass<unsigned_char> *this,Range<unsigned_char> *r)

{
  bool bVar1;
  uchar uVar2;
  uchar uVar3;
  reference pvVar4;
  Range<unsigned_char> *r_local;
  CharClass<unsigned_char> *this_local;
  
  bVar1 = std::
          vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
          ::empty(&this->m_ranges);
  if (bVar1) {
    std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
    ::push_back(&this->m_ranges,r);
  }
  else {
    pvVar4 = std::
             vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ::back(&this->m_ranges);
    uVar2 = Range<unsigned_char>::end(pvVar4);
    uVar3 = Range<unsigned_char>::start(r);
    if (uVar2 == uVar3) {
      pvVar4 = std::
               vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
               ::back(&this->m_ranges);
      uVar2 = Range<unsigned_char>::end(r);
      Range<unsigned_char>::end(pvVar4,uVar2);
    }
    else {
      std::
      vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
      push_back(&this->m_ranges,r);
    }
  }
  return;
}

Assistant:

void append(const Range<TCHAR>& r)
    {
        if (m_ranges.empty())
        {
            m_ranges.push_back(r);
        }
        else
        {
            if (m_ranges.back().end() == r.start())
            {
                m_ranges.back().end(r.end());
            }
            else
            {
                m_ranges.push_back(r);
            }
        }
    }